

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool roaring_bitmap_intersect_with_range(roaring_bitmap_t *bm,uint64_t x,uint64_t y)

{
  _Bool _Var1;
  roaring_uint32_iterator_t it;
  roaring_uint32_iterator_t local_40;
  
  if (x < y) {
    local_40.container_index = 0;
    local_40.parent = bm;
    local_40.has_value = loadfirstvalue(&local_40);
    _Var1 = roaring_uint32_iterator_move_equalorlarger(&local_40,(uint32_t)x);
    return local_40.current_value < y && _Var1;
  }
  return false;
}

Assistant:

bool roaring_bitmap_intersect_with_range(const roaring_bitmap_t *bm, uint64_t x,
                                         uint64_t y) {
    if (x >= y) {
        // Empty range.
        return false;
    }
    roaring_uint32_iterator_t it;
    roaring_iterator_init(bm, &it);
    if (!roaring_uint32_iterator_move_equalorlarger(&it, (uint32_t)x)) {
        // No values above x.
        return false;
    }
    if (it.current_value >= y) {
        // No values below y.
        return false;
    }
    return true;
}